

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesDebugStringTest_RoundTrip_Test::
FeaturesDebugStringTest_RoundTrip_Test(FeaturesDebugStringTest_RoundTrip_Test *this)

{
  FeaturesDebugStringTest_RoundTrip_Test *this_local;
  
  FeaturesDebugStringTest::FeaturesDebugStringTest(&this->super_FeaturesDebugStringTest);
  (this->super_FeaturesDebugStringTest).super_FeaturesTest.super_FeaturesBaseTest.super_Test.
  _vptr_Test = (_func_int **)&PTR__FeaturesDebugStringTest_RoundTrip_Test_029ae670;
  (this->super_FeaturesDebugStringTest).
  super_WithParamInterface<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__FeaturesDebugStringTest_RoundTrip_Test_029ae6b0;
  return;
}

Assistant:

TEST_P(FeaturesDebugStringTest, RoundTrip) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(GetFileProto());
  ASSERT_THAT(file, NotNull());

  LoadFile("google/protobuf/descriptor.proto",
           DescriptorProto::GetDescriptor()->file()->DebugString());
  LoadFile("google/protobuf/unittest_features.proto",
           pb::TestFeatures::GetDescriptor()->file()->DebugString());
  const FileDescriptor* roundtripped =
      LoadFile(file->name(), file->DebugString());

  FileDescriptorProto roundtripped_proto;
  roundtripped->CopyTo(&roundtripped_proto);
  EXPECT_THAT(roundtripped_proto, EqualsRoundTrip())
      << "With generated proto file: \n"
      << file->DebugString();
}